

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int __thiscall
CVmObjBigNum::getp_atan(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  long *plVar4;
  size_t sVar5;
  char *in_RDX;
  undefined4 in_ESI;
  char *in_RDI;
  bool bVar6;
  char *tmp;
  ulong n;
  int term_neg;
  err_frame_t err_cur__;
  char *pi;
  char *ext5;
  char *ext4;
  char *ext3;
  char *ext2;
  char *ext1;
  uint hdl5;
  uint hdl4;
  uint hdl3;
  uint hdl2;
  uint hdl1;
  size_t prec;
  char *new_ext;
  uint *ext;
  char *src;
  uint *dst;
  char **in_stack_fffffffffffffe28;
  unsigned_long *in_stack_fffffffffffffe30;
  void *pvVar7;
  vm_val_t *in_stack_fffffffffffffe38;
  undefined8 uVar8;
  char *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  char *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe70;
  long local_188;
  uint local_178 [2];
  undefined8 local_170;
  void *local_168;
  char *in_stack_ffffffffffffff70;
  char *pcVar9;
  char *in_stack_ffffffffffffff78;
  char *ext_00;
  undefined1 local_80 [8];
  undefined1 local_78 [4];
  int is_acos;
  char *in_stack_ffffffffffffff90;
  char *pcVar10;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  size_t local_50;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  pcVar9 = in_RDI;
  local_50 = get_prec((char *)0x3081f1);
  iVar1 = setup_getp_0((CVmObjBigNum *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)
                       ,(vm_obj_id_t)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                       in_stack_fffffffffffffe38,(uint *)in_stack_fffffffffffffe30,
                       in_stack_fffffffffffffe28);
  if (iVar1 != 0) {
    return 1;
  }
  cache_pi((size_t)in_stack_ffffffffffffff70);
  ext = &local_5c;
  src = &stack0xffffffffffffff78;
  dst = &local_60;
  alloc_temp_regs(local_50 + 3,5,&stack0xffffffffffffff90,&local_54,local_78,&local_58,local_80);
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  local_170 = *puVar3;
  plVar4 = (long *)_ZTW11G_err_frame();
  *plVar4 = (long)local_178;
  local_178[0] = _setjmp((__jmp_buf_tag *)&stack0xfffffffffffffea0);
  if (local_178[0] == 0) {
    iVar1 = get_exp((char *)0x308324);
    if ((iVar1 < -1) || (iVar1 = get_exp((char *)0x308337), 2 < iVar1)) {
      iVar1 = get_exp((char *)0x30834e);
      bVar6 = -1 < iVar1;
      if (bVar6) {
        copy_val((char *)dst,src,(int)((ulong)ext >> 0x20));
        div_by_long(in_stack_fffffffffffffe40,(unsigned_long)in_stack_fffffffffffffe38,
                    in_stack_fffffffffffffe30);
        pcVar10 = in_stack_ffffffffffffff90;
        iVar1 = get_neg(*(char **)(in_RDI + 8));
        set_neg(in_stack_ffffffffffffff90,iVar1);
        in_stack_fffffffffffffe60 = _local_78;
        get_one();
        compute_quotient_into
                  ((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),pcVar9,
                   (char *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),in_RDX);
      }
      else {
        set_zero((char *)ext);
        copy_val((char *)dst,src,(int)((ulong)ext >> 0x20));
        pcVar10 = in_stack_ffffffffffffff90;
      }
      local_188 = 1;
      compute_prod_into(in_stack_fffffffffffffe70,in_RDI,in_stack_fffffffffffffe60);
      do {
        copy_val((char *)dst,src,(int)((ulong)ext >> 0x20));
        div_by_long(in_stack_fffffffffffffe40,(unsigned_long)in_stack_fffffffffffffe38,
                    in_stack_fffffffffffffe30);
        pcVar9 = in_stack_ffffffffffffff70;
        ext_00 = in_stack_ffffffffffffff78;
        if (bVar6) {
          iVar1 = get_neg(in_stack_ffffffffffffff78);
          set_neg(in_stack_ffffffffffffff78,(uint)((iVar1 != 0 ^ 0xffU) & 1));
          pcVar9 = in_stack_ffffffffffffff70;
        }
        in_stack_ffffffffffffff70 = pcVar10;
        if (local_188 != 1) {
          iVar1 = is_zero(ext_00);
          if (iVar1 != 0) goto LAB_00308509;
          iVar2 = get_exp((char *)0x3084d4);
          iVar1 = get_exp((char *)0x3084e5);
          iVar2 = iVar2 - iVar1;
          sVar5 = get_prec((char *)0x3084fe);
          if ((int)sVar5 < iVar2) goto LAB_00308509;
        }
        compute_sum_into((char *)dst,src,(char *)ext);
        local_188 = local_188 + 2;
        bVar6 = (bool)(bVar6 ^ 1);
        compute_prod_into(in_stack_ffffffffffffff70,in_RDI,in_stack_fffffffffffffe60);
        in_stack_ffffffffffffff78 = _local_78;
        _local_78 = ext_00;
        pcVar10 = pcVar9;
      } while( true );
    }
    compute_prod_into(in_stack_fffffffffffffe70,in_RDI,in_stack_fffffffffffffe60);
    is_acos = (int)((ulong)_local_78 >> 0x20);
    increment_abs((char *)in_stack_fffffffffffffe30);
    compute_sqrt_into(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    get_one();
    compute_quotient_into
              ((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),pcVar9,
               (char *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),in_RDX);
    calc_asincos_into((char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      in_stack_ffffffffffffff90,is_acos);
    iVar1 = get_neg(*(char **)(in_RDI + 8));
    if (iVar1 != 0) {
      negate((char *)ext);
    }
  }
LAB_00308692:
  if ((local_178[0] & 0x8000) == 0) {
    local_178[0] = local_178[0] | 0x8000;
    release_temp_regs(5,(ulong)local_54,(ulong)local_58,(ulong)local_5c,(ulong)local_60,
                      (ulong)in_stack_ffffffffffffff9c);
  }
  uVar8 = local_170;
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  *puVar3 = uVar8;
  if ((local_178[0] & 0x4001) != 0) {
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(uint *)*puVar3 & 2) != 0) {
      plVar4 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar4 + 0x10));
    }
    pvVar7 = local_168;
    plVar4 = (long *)_ZTW11G_err_frame();
    *(void **)(*plVar4 + 0x10) = pvVar7;
    err_rethrow();
  }
  if ((local_178[0] & 2) != 0) {
    free(local_168);
  }
  CVmStack::discard();
  return 1;
LAB_00308509:
  copy_val((char *)dst,src,(int)((ulong)ext >> 0x20));
  goto LAB_00308692;
}

Assistant:

int CVmObjBigNum::getp_atan(VMG_ vm_obj_id_t self,
                            vm_val_t *retval, uint *argc)
{
    char *new_ext;
    size_t prec = get_prec(ext_);
    uint hdl1, hdl2, hdl3, hdl4, hdl5;
    char *ext1, *ext2, *ext3, *ext4, *ext5;
    const char *pi;

    /* check arguments and set up the result */
    if (setup_getp_0(vmg_ self, retval, argc, &new_ext))
        return TRUE;

    /* cache pi to our working precision */
    pi = cache_pi(prec + 3);

    /* allocate some temporary registers */
    alloc_temp_regs(prec + 3, 5,
                    &ext1, &hdl1, &ext2, &hdl2, &ext3, &hdl3,
                    &ext4, &hdl4, &ext5, &hdl5);

    /* catch errors so we can be sure to free registers */
    err_try
    {
        /*
         *   If x has absolute value close to 1, either above or below,
         *   our two series don't converge very rapidly.  Happily, we can
         *   fall back on an alternative in these case by using the
         *   relation
         *   
         *   arctan(x) = (+/-)arccos(1/sqrt(x^2+1))
         *   
         *   (The sign of the result is the same as the sign of x.)  Since
         *   we already have routines for arccosine and square root, this
         *   calculation is easy.
         *   
         *   If x doesn't have absolute value close to 1, use the
         *   appropriate series, since they converge rapidly.  
         */
        if (get_exp(ext_) < -1 || get_exp(ext_) > 2)
        {
            int term_neg;
            ulong n;
            
            /* 
             *   exponent less than -1 -> the number has a small absolute
             *   value - use the small-x series expansion:
             *   
             *   x - x^3/3 + x^5/5 - x^7/7 ...
             *   
             *   OR
             *   
             *   exponent greater than 2 -> the number has a large
             *   absolute value, so the large-x series expansion should
             *   converge quickly:
             *   
             *   +/- pi/2 - 1/x + 1/3x^3 - 1/5x^5 ...
             *   
             *   (the sign of the leading pi/2 term is positive if x is
             *   positive, negative if x is negative)
             *   
             *   We can commonize these expressions by defining x' = x for
             *   small x and x' = 1/x for large x, defining C as 0 for
             *   small x and +/-pi/2 for large X, defining N as +1 for
             *   small x and -1 for large x, and rewriting the series as:
             *   
             *   C + Nx' - Nx'^3/3 + Nx'^5/5 + ...  
             */

            /* check for large or small value */
            if (get_exp(ext_) < 0)
            {
                /* small number - start with zero in the accumulator (r1) */
                set_zero(ext1);

                /* get the current power of x' into r2 - this is simply x */
                copy_val(ext2, ext_, FALSE);

                /* the first term (x) is positive */
                term_neg = FALSE;
            }
            else
            {
                /* large number - start with pi/2 in the accumulator (r1) */
                copy_val(ext1, pi, TRUE);
                div_by_long(ext1, 2);

                /* if x is negative, make that -pi/2 */
                set_neg(ext1, get_neg(ext_));

                /* get 1/x into r2 - this is our x' term value */
                compute_quotient_into(ext2, 0, get_one(), ext_);

                /* the first term (1/x) is negative */
                term_neg = TRUE;
            }

            /* start at the first term */
            n = 1;

            /* 
             *   get x'^2 into r3 - we'll use this to calculate each
             *   subsequent term (we need x', x'^3, x'^5, etc) 
             */
            compute_prod_into(ext3, ext2, ext2);

            /* iterate until we reach the desired precision */
            for (;;)
            {
                char *tmp;
                
                /* copy the current power term from r2 into r4 */
                copy_val(ext4, ext2, FALSE);

                /* 
                 *   divide by the current term constant (we'll never have
                 *   to compute billions of terms to reach our maximum
                 *   possible 64k digits of precision, so 'n' will always be
                 *   way less than the div_by_long limit of ULONG_MAX/10) 
                 */
                div_by_long(ext4, n);

                /* negate this term if necessary */
                if (term_neg)
                    set_neg(ext4, !get_neg(ext4));

                /* 
                 *   if we're under the radar on precision, stop looping
                 *   (don't stop on the first term, since the accumulator
                 *   hasn't been fully primed yet) 
                 */
                if (n != 1
                    && (is_zero(ext4)
                        || (get_exp(ext1) - get_exp(ext4)
                            > (int)get_prec(ext1))))
                    break;

                /* compute the sum of the accumulator and this term */
                compute_sum_into(ext5, ext1, ext4);

                /* swap the result back into the accumulator */
                tmp = ext1;
                ext1 = ext5;
                ext5 = tmp;

                /* 
                 *   move on to the next term - advance n by 2 and swap
                 *   the term sign 
                 */
                n += 2;
                term_neg = !term_neg;

                /* 
                 *   compute the next power term - multiply r2 (the latest
                 *   x' power) by r3 (x'^2) 
                 */
                compute_prod_into(ext4, ext2, ext3);

                /* swap r4 back into r2 - this is now the latest power */
                tmp = ext2;
                ext2 = ext4;
                ext4 = tmp;
            }

            /* store the result, rounding as needed */
            copy_val(new_ext, ext1, TRUE);
        }